

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::MatchGroupInst::Exec
          (MatchGroupInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint uVar1;
  uint64 *puVar2;
  UnicodeDataCaseMapper *pUVar3;
  Type TVar4;
  Char CVar5;
  GroupInfo *pGVar6;
  Type pRVar7;
  StandardChars<char16_t> *pSVar8;
  code *pcVar9;
  Matcher *this_00;
  anon_class_8_1_b578bc12 aVar10;
  bool bVar11;
  byte bVar12;
  bool bVar13;
  ushort uVar14;
  ushort uVar15;
  char16 cVar16;
  char16 cVar17;
  BOOL BVar18;
  undefined4 *puVar19;
  unsigned_long uVar20;
  uint uVar21;
  Type *pTVar22;
  uint uVar23;
  int iVar24;
  codepoint_t codePointValue;
  long lVar25;
  anon_class_8_1_a81546ea getNextCodePoint;
  undefined8 local_78;
  unsigned_long lastOcc;
  uint local_60 [2];
  uint tblidx;
  uint acth;
  Matcher *local_50;
  anon_class_8_1_b578bc12 toCanonical;
  codepoint_t local_3c;
  uint local_38;
  codepoint_t groupCodePoint;
  
  toCanonical.matcher._0_4_ = inputLength;
  iVar24 = (this->super_GroupMixin).groupId;
  lVar25 = (long)iVar24;
  if ((lVar25 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar24)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar19 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar19 = 1;
    bVar11 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                        "groupId >= 0 && groupId < program->numGroups");
    if (!bVar11) {
      pcVar9 = (code *)invalidInstructionException();
      (*pcVar9)();
    }
    *puVar19 = 0;
  }
  pGVar6 = (matcher->groupInfos).ptr;
  uVar23 = pGVar6[lVar25].length;
  if (1 < uVar23 + 1) {
    if ((CharCount)toCanonical.matcher - *inputOffset < uVar23) {
      bVar11 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks)
      ;
      return bVar11;
    }
    codePointValue = pGVar6[lVar25].offset;
    uVar23 = uVar23 + codePointValue;
    _tblidx = (ulong)uVar23;
    TVar4 = ((matcher->program).ptr)->flags;
    if ((TVar4 & IgnoreCaseRegexFlag) == NoRegexFlags) {
      pRVar7 = matcher->stats;
      groupCodePoint = *inputOffset;
      do {
        if (pRVar7 != (Type)0x0) {
          puVar2 = &pRVar7->numCompares;
          *puVar2 = *puVar2 + 1;
        }
        if (input[codePointValue] != input[groupCodePoint]) {
          *inputOffset = groupCodePoint + 1;
          bVar11 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,
                                 qcTicks);
          groupCodePoint = (codepoint_t)bVar11;
          bVar11 = false;
          goto LAB_00f0a2e6;
        }
        codePointValue = codePointValue + 1;
        groupCodePoint = groupCodePoint + 1;
      } while (codePointValue < uVar23);
      *inputOffset = groupCodePoint;
      bVar11 = true;
    }
    else {
      groupCodePoint = (codepoint_t)TVar4;
      local_50 = matcher;
      aVar10.matcher = (Matcher *)input;
      local_38 = codePointValue;
      if ((TVar4 & UnicodeRegexFlag) == NoRegexFlags) {
        do {
          toCanonical.matcher = aVar10.matcher;
          if (local_50->stats != (Type)0x0) {
            puVar2 = &local_50->stats->numCompares;
            *puVar2 = *puVar2 + 1;
          }
          pSVar8 = (local_50->standardChars).ptr;
          uVar14 = *(ushort *)
                    ((long)&((toCanonical.matcher)->pattern).ptr + (ulong)codePointValue * 2);
          pUVar3 = &pSVar8->unicodeDataCaseMapper;
          if (uVar14 < 0x100) {
            BVar18 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                               (&pUVar3->toEquivs,(uint)uVar14);
            if (BVar18 == 0) {
              uVar20 = (pSVar8->unicodeDataCaseMapper).toEquivs.defv;
            }
            else {
              uVar20 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::
                       GetDirectMap(&pUVar3->toEquivs,(uint)uVar14);
            }
          }
          else {
            bVar11 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                               (&pUVar3->toEquivs,(uint)uVar14,&local_78);
            pTVar22 = &(pSVar8->unicodeDataCaseMapper).toEquivs.defv;
            if (bVar11) {
              pTVar22 = &local_78;
            }
            uVar20 = *pTVar22;
          }
          if (uVar20 != 0xffffffffffffffff) {
            uVar14 = (ushort)uVar20;
          }
          pSVar8 = (local_50->standardChars).ptr;
          uVar23 = *inputOffset;
          *inputOffset = uVar23 + 1;
          uVar15 = *(ushort *)((long)&((toCanonical.matcher)->pattern).ptr + (ulong)uVar23 * 2);
          pUVar3 = &pSVar8->unicodeDataCaseMapper;
          if (uVar15 < 0x100) {
            BVar18 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                               (&pUVar3->toEquivs,(uint)uVar15);
            if (BVar18 == 0) {
              uVar20 = (pSVar8->unicodeDataCaseMapper).toEquivs.defv;
            }
            else {
              uVar20 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::
                       GetDirectMap(&pUVar3->toEquivs,(uint)uVar15);
            }
          }
          else {
            bVar11 = CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                               (&pUVar3->toEquivs,(uint)uVar15,&local_78);
            pTVar22 = &(pSVar8->unicodeDataCaseMapper).toEquivs.defv;
            if (bVar11) {
              pTVar22 = &local_78;
            }
            uVar20 = *pTVar22;
          }
          if (uVar20 != 0xffffffffffffffff) {
            uVar15 = (ushort)uVar20;
          }
          bVar11 = uVar14 == uVar15;
          if (!bVar11) {
            bVar13 = Matcher::Fail(local_50,(Char *)toCanonical.matcher,inputOffset,instPointer,
                                   contStack,assertionStack,qcTicks);
            groupCodePoint = (codepoint_t)bVar13;
            break;
          }
          codePointValue = codePointValue + 1;
          aVar10.matcher = toCanonical.matcher;
        } while (codePointValue < tblidx);
      }
      else {
        do {
          uVar23 = local_38;
          uVar21 = (uint)_tblidx;
          if (local_38 < uVar21) {
            local_3c = (codepoint_t)(ushort)input[local_38];
            bVar11 = Js::NumberUtilities::IsSurrogateLowerPart(local_3c);
            if ((bVar11) && (uVar1 = local_38 + 1, uVar1 != uVar21)) {
              CVar5 = input[uVar1];
              bVar11 = Js::NumberUtilities::IsSurrogateUpperPart((uint)(ushort)CVar5);
              if (bVar11) {
                local_3c = Js::NumberUtilities::SurrogatePairAsCodePoint
                                     (local_3c,(uint)(ushort)CVar5);
                uVar1 = local_38 + 2;
              }
              local_38 = uVar1;
              uVar21 = (uint)_tblidx;
            }
            else {
              local_38 = local_38 + 1;
            }
          }
          if (uVar23 < uVar21) {
            if (*inputOffset < (CharCount)toCanonical.matcher) {
              codePointValue = (codepoint_t)(ushort)input[*inputOffset];
              bVar11 = Js::NumberUtilities::IsSurrogateLowerPart(codePointValue);
              iVar24 = 1;
              if (bVar11) {
                if (*inputOffset + 1 != (CharCount)toCanonical.matcher) {
                  CVar5 = input[*inputOffset + 1];
                  bVar11 = Js::NumberUtilities::IsSurrogateUpperPart((uint)(ushort)CVar5);
                  iVar24 = 1;
                  if (bVar11) {
                    codePointValue =
                         Js::NumberUtilities::SurrogatePairAsCodePoint
                                   (codePointValue,(uint)(ushort)CVar5);
                    iVar24 = 2;
                  }
                }
              }
              *inputOffset = *inputOffset + iVar24;
            }
            bVar11 = Js::NumberUtilities::IsInSupplementaryPlane(local_3c);
            this_00 = local_50;
            if (bVar11) {
              local_60[0] = 0;
              local_60[1] = 0;
              CaseInsensitive::RangeToEquivClass
                        (local_60,local_3c,local_3c,local_60 + 1,(codepoint_t *)&local_78);
              bVar11 = true;
              if (((codePointValue != (codepoint_t)local_78) &&
                  (bVar11 = true, codePointValue != local_78._4_4_)) &&
                 (bVar11 = true, codePointValue != (codepoint_t)lastOcc)) {
                bVar11 = codePointValue == lastOcc._4_4_;
              }
            }
            else {
              cVar16 = CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::
                       ToCanonical(&((local_50->standardChars).ptr)->caseFoldingCaseMapper,
                                   (char16)local_3c);
              cVar17 = CaseMapper<UnifiedRegex::CaseMapper<UnifiedRegex::TrivialCaseMapper>_>::
                       ToCanonical(&((this_00->standardChars).ptr)->caseFoldingCaseMapper,
                                   (char16)codePointValue);
              bVar11 = cVar16 == cVar17;
            }
            if (!bVar11) {
              bVar11 = Matcher::Fail(this_00,input,inputOffset,instPointer,contStack,assertionStack,
                                     qcTicks);
              groupCodePoint = (codepoint_t)bVar11;
              iVar24 = 1;
              goto LAB_00f0a2d5;
            }
            iVar24 = 0;
            bVar11 = true;
          }
          else {
            iVar24 = 3;
LAB_00f0a2d5:
            bVar11 = false;
          }
        } while (iVar24 == 0);
        if (iVar24 == 3) {
          bVar11 = true;
        }
      }
    }
LAB_00f0a2e6:
    bVar12 = (byte)groupCodePoint;
    if (!bVar11) goto LAB_00f09f2f;
  }
  *instPointer = *instPointer + 5;
  bVar12 = 0;
LAB_00f09f2f:
  return (bool)(bVar12 & 1);
}

Assistant:

inline bool MatchGroupInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        GroupInfo* const info = matcher.GroupIdToGroupInfo(groupId);
        if (!info->IsUndefined() && info->length > 0)
        {
            if (info->length > inputLength - inputOffset)
            {
                return matcher.Fail(FAIL_PARAMETERS);
            }

            CharCount groupOffset = info->offset;
            const CharCount groupEndOffset = groupOffset + info->length;

            bool isCaseInsensitiveMatch = (matcher.program->flags & IgnoreCaseRegexFlag) != 0;
            bool isCodePointList = (matcher.program->flags & UnicodeRegexFlag) != 0;

            // This is the only place in the runtime machinery we need to convert characters to their equivalence class
            if (isCaseInsensitiveMatch && isCodePointList)
            {
                auto getNextCodePoint = [=](CharCount &offset, CharCount endOffset, codepoint_t &codePoint) {
                    if (endOffset <= offset)
                    {
                        return false;
                    }

                    Char lowerPart = input[offset];
                    if (!Js::NumberUtilities::IsSurrogateLowerPart(lowerPart) || offset + 1 == endOffset)
                    {
                        codePoint = lowerPart;
                        offset += 1;
                        return true;
                    }

                    Char upperPart = input[offset + 1];
                    if (!Js::NumberUtilities::IsSurrogateUpperPart(upperPart))
                    {
                        codePoint = lowerPart;
                        offset += 1;
                    }
                    else
                    {
                        codePoint = Js::NumberUtilities::SurrogatePairAsCodePoint(lowerPart, upperPart);
                        offset += 2;
                    }

                    return true;
                };

                codepoint_t equivs[CaseInsensitive::EquivClassSize];
                while (true)
                {
                    codepoint_t groupCodePoint;
                    bool hasGroupCodePoint = getNextCodePoint(groupOffset, groupEndOffset, groupCodePoint);
                    if (!hasGroupCodePoint)
                    {
                        break;
                    }

                    // We don't need to verify that there is a valid input code point since at the beginning
                    // of the function, we make sure that the length of the input is at least as long as the
                    // length of the group.
                    codepoint_t inputCodePoint;
                    getNextCodePoint(inputOffset, inputLength, inputCodePoint);

                    bool doesMatch = false;
                    if (!Js::NumberUtilities::IsInSupplementaryPlane(groupCodePoint))
                    {
                        auto toCanonical = [&](codepoint_t c) {
                            return matcher.standardChars->ToCanonical(
                                CaseInsensitive::MappingSource::CaseFolding,
                                static_cast<char16>(c));
                        };
                        doesMatch = (toCanonical(groupCodePoint) == toCanonical(inputCodePoint));
                    }
                    else
                    {
                        uint tblidx = 0;
                        uint acth = 0;
                        CaseInsensitive::RangeToEquivClass(tblidx, groupCodePoint, groupCodePoint, acth, equivs);
                        CompileAssert(CaseInsensitive::EquivClassSize == 4);
                        doesMatch =
                            inputCodePoint == equivs[0]
                            || inputCodePoint == equivs[1]
                            || inputCodePoint == equivs[2]
                            || inputCodePoint == equivs[3];
                    }

                    if (!doesMatch)
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
            }
            else if (isCaseInsensitiveMatch)
            {
                do
                {
#if ENABLE_REGEX_CONFIG_OPTIONS
                    matcher.CompStats();
#endif
                    auto toCanonical = [&](CharCount &offset) {
                        return matcher.standardChars->ToCanonical(CaseInsensitive::MappingSource::UnicodeData, input[offset++]);
                    };

                    if (toCanonical(groupOffset) != toCanonical(inputOffset))
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
                while (groupOffset < groupEndOffset);
            }
            else
            {
                do
                {
#if ENABLE_REGEX_CONFIG_OPTIONS
                    matcher.CompStats();
#endif
                    if (input[groupOffset++] != input[inputOffset++])
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
                while (groupOffset < groupEndOffset);
            }
        }
        // else: trivially match empty string

        instPointer += sizeof(*this);
        return false;
    }